

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int init_compatible_string_p(node_t_conflict n,type *el_type)

{
  node_code_t nVar1;
  uint uVar2;
  
  nVar1 = n->code;
  if (nVar1 == N_STR32) {
    uVar2 = 0;
    if (el_type->mode == TM_BASIC) {
      uVar2 = (uint)((el_type->u).basic_type == TP_UINT);
    }
    return uVar2;
  }
  if (nVar1 == N_STR16) {
    if ((el_type->mode == TM_BASIC) && ((el_type->u).basic_type == TP_USHORT)) {
      return 1;
    }
  }
  else if (((nVar1 == N_STR) && (el_type->mode == TM_BASIC)) &&
          (0xfffffffc < (el_type->u).basic_type - TP_SHORT)) {
    return 1;
  }
  return 0;
}

Assistant:

static int init_compatible_string_p (node_t n, struct type *el_type) {
  return ((n->code == N_STR && char_type_p (el_type))
          || (n->code == N_STR16 && el_type->mode == TM_BASIC
              && el_type->u.basic_type == get_uint_basic_type (2))
          || (n->code == N_STR32 && el_type->mode == TM_BASIC
              && el_type->u.basic_type == get_uint_basic_type (4)));
}